

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O3

interval_t duckdb::ToCenturiesOperator::Operation<int,duckdb::interval_t>(int input)

{
  interval_t iVar1;
  bool bVar2;
  OutOfRangeException *this;
  undefined1 auVar3 [12];
  int result_1;
  interval_t result;
  int local_74;
  string local_70;
  int local_50;
  undefined4 uStack_4c;
  int64_t local_48;
  string local_40;
  
  bVar2 = duckdb::TryCast::Operation<int,int>(input,&local_74,false);
  if (!bVar2) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<int,int>(&local_70,(duckdb *)(ulong)(uint)input,auVar3._8_4_);
    duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_70);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  uStack_4c = 0;
  local_48 = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<int,int,int>(local_74,0x4b0,&local_50);
  if (bVar2) {
    iVar1.days = uStack_4c;
    iVar1.months = local_50;
    iVar1.micros = local_48;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Interval value %s centuries out of range","");
  NumericHelper::ToString<int>(&local_40,input);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this,&local_70,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_CENTURY,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %s centuries out of range", NumericHelper::ToString(input));
		}
		return result;
	}